

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

Maybe<kj::Array<unsigned_char>_> * __thiscall
kj::Exception::releaseDetail
          (Maybe<kj::Array<unsigned_char>_> *__return_storage_ptr__,Exception *this,
          DetailTypeId typeId)

{
  ArrayDisposer *pAVar1;
  Detail *pDVar2;
  Array<unsigned_char> *pAVar3;
  undefined1 local_58 [8];
  Array<unsigned_char> result;
  Detail *detail;
  Detail *__end1;
  Detail *__begin1;
  Vector<kj::Exception::Detail> *__range1;
  DetailTypeId typeId_local;
  Exception *this_local;
  
  __end1 = Vector<kj::Exception::Detail>::begin(&this->details);
  pDVar2 = Vector<kj::Exception::Detail>::end(&this->details);
  while( true ) {
    if (__end1 == pDVar2) {
      Maybe<kj::Array<unsigned_char>_>::Maybe(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    result.disposer = (ArrayDisposer *)__end1;
    if (__end1->id == typeId) break;
    __end1 = __end1 + 1;
  }
  pAVar3 = mv<kj::Array<unsigned_char>>(&__end1->value);
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_58,pAVar3);
  pAVar1 = result.disposer;
  pDVar2 = Vector<kj::Exception::Detail>::back(&this->details);
  if ((Detail *)pAVar1 != pDVar2) {
    pDVar2 = Vector<kj::Exception::Detail>::back(&this->details);
    pDVar2 = mv<kj::Exception::Detail>(pDVar2);
    Detail::operator=((Detail *)result.disposer,pDVar2);
  }
  Vector<kj::Exception::Detail>::removeLast(&this->details);
  pAVar3 = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_58);
  Maybe<kj::Array<unsigned_char>_>::Maybe(__return_storage_ptr__,pAVar3);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<byte>> Exception::releaseDetail(DetailTypeId typeId) {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      kj::Array<byte> result = kj::mv(detail.value);
      if (&detail != &details.back()) {
        detail = kj::mv(details.back());
      }
      details.removeLast();
      return kj::mv(result);
    }
  }
  return kj::none;
}